

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTFusionRTQF.cpp
# Opt level: O3

void __thiscall
RTFusionRTQF::newIMUData(RTFusionRTQF *this,RTIMU_DATA *data,RTIMUSettings *settings)

{
  RTVector3 *pRVar1;
  RTQuaternion *this_00;
  uint64_t uVar2;
  char *pcVar3;
  RTVector3 *pRVar4;
  float fVar5;
  RTVector3 local_3c;
  
  if ((this->super_RTFusion).m_debug == true) {
    puts("\n------");
    fflush(_stdout);
    this->m_sampleNumber = this->m_sampleNumber + 1;
    printf("IMU update delta time: %f, sample %d\n",(double)this->m_timeDelta);
    fflush(_stdout);
  }
  this->m_sampleNumber = this->m_sampleNumber + 1;
  if ((this->super_RTFusion).m_enableGyro == true) {
    pRVar4 = &data->gyro;
  }
  else {
    pRVar4 = &local_3c;
    RTVector3::RTVector3(pRVar4);
  }
  RTVector3::operator=(&this->m_gyro,pRVar4);
  pRVar4 = &(this->super_RTFusion).m_accel;
  RTVector3::operator=(pRVar4,&data->accel);
  pRVar1 = &(this->super_RTFusion).m_compass;
  RTVector3::operator=(pRVar1,&data->compass);
  (this->super_RTFusion).m_compassValid = data->compassValid;
  uVar2 = data->timestamp;
  if ((this->super_RTFusion).m_firstTime == true) {
    (this->super_RTFusion).m_lastFusionTime = uVar2;
    RTFusion::calculatePose(&this->super_RTFusion,pRVar4,pRVar1,settings->m_compassAdjDeclination);
    pRVar4 = &(this->super_RTFusion).m_measuredPose;
    RTQuaternion::fromEuler(&this->m_stateQ,pRVar4);
    RTQuaternion::operator=(&(this->super_RTFusion).m_fusionQPose,&this->m_stateQ);
    RTVector3::operator=(&(this->super_RTFusion).m_fusionPose,pRVar4);
    (this->super_RTFusion).m_firstTime = false;
  }
  else {
    fVar5 = (float)(uVar2 - (this->super_RTFusion).m_lastFusionTime) / 1e+06;
    this->m_timeDelta = fVar5;
    (this->super_RTFusion).m_lastFusionTime = uVar2;
    if (fVar5 <= 0.0) {
      return;
    }
    RTFusion::calculatePose
              (&this->super_RTFusion,&data->accel,&data->compass,settings->m_compassAdjDeclination);
    predict(this);
    update(this);
    this_00 = &this->m_stateQ;
    pRVar4 = &(this->super_RTFusion).m_fusionPose;
    RTQuaternion::toEuler(this_00,pRVar4);
    RTQuaternion::operator=(&(this->super_RTFusion).m_fusionQPose,this_00);
    if ((this->super_RTFusion).m_debug == true) {
      pRVar1 = &(this->super_RTFusion).m_measuredPose;
      pcVar3 = RTMath::displayRadians("Measured pose",pRVar1);
      printf("%s",pcVar3);
      fflush(_stdout);
      pcVar3 = RTMath::displayRadians("RTQF pose",pRVar4);
      printf("%s",pcVar3);
      fflush(_stdout);
      pcVar3 = RTMath::displayRadians("Measured quat",pRVar1);
      printf("%s",pcVar3);
      fflush(_stdout);
      pcVar3 = RTMath::display("RTQF quat",this_00);
      printf("%s",pcVar3);
      fflush(_stdout);
      pcVar3 = RTMath::display("Error quat",&this->m_stateQError);
      printf("%s",pcVar3);
      fflush(_stdout);
    }
  }
  data->fusionPoseValid = true;
  data->fusionQPoseValid = true;
  RTVector3::operator=(&data->fusionPose,&(this->super_RTFusion).m_fusionPose);
  RTQuaternion::operator=(&data->fusionQPose,&(this->super_RTFusion).m_fusionQPose);
  return;
}

Assistant:

void RTFusionRTQF::newIMUData(RTIMU_DATA& data, const RTIMUSettings *settings)
{
    if (m_debug) {
        HAL_INFO("\n------\n");
        HAL_INFO2("IMU update delta time: %f, sample %d\n", m_timeDelta, m_sampleNumber++);
    }
    m_sampleNumber++;

    if (m_enableGyro)
        m_gyro = data.gyro;
    else
        m_gyro = RTVector3();
    m_accel = data.accel;
    m_compass = data.compass;
    m_compassValid = data.compassValid;

    if (m_firstTime) {
        m_lastFusionTime = data.timestamp;
        calculatePose(m_accel, m_compass, settings->m_compassAdjDeclination);

        //  initialize the poses

        m_stateQ.fromEuler(m_measuredPose);
        m_fusionQPose = m_stateQ;
        m_fusionPose = m_measuredPose;
        m_firstTime = false;
    } else {
        m_timeDelta = (RTFLOAT)(data.timestamp - m_lastFusionTime) / (RTFLOAT)1000000;
        m_lastFusionTime = data.timestamp;
        if (m_timeDelta <= 0)
            return;

        calculatePose(data.accel, data.compass, settings->m_compassAdjDeclination);

        predict();
        update();
        m_stateQ.toEuler(m_fusionPose);
        m_fusionQPose = m_stateQ;

        if (m_debug) {
            HAL_INFO(RTMath::displayRadians("Measured pose", m_measuredPose));
            HAL_INFO(RTMath::displayRadians("RTQF pose", m_fusionPose));
            HAL_INFO(RTMath::displayRadians("Measured quat", m_measuredPose));
            HAL_INFO(RTMath::display("RTQF quat", m_stateQ));
            HAL_INFO(RTMath::display("Error quat", m_stateQError));
         }
    }
    data.fusionPoseValid = true;
    data.fusionQPoseValid = true;
    data.fusionPose = m_fusionPose;
    data.fusionQPose = m_fusionQPose;
}